

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyEasy.cpp
# Opt level: O3

void __thiscall
chrono::ChBodyEasyMesh::ChBodyEasyMesh
          (ChBodyEasyMesh *this,string *filename,double density,
          shared_ptr<chrono::ChMaterialSurface> *material,double sphere_swept,
          ChCollisionSystemType collision_type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  undefined1 local_68 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_48;
  pointer local_30;
  pointer local_28;
  
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW =
       (ChLoadableUVW)&PTR__ChLoadable_00b04a88;
  local_30 = (pointer)density;
  local_28 = (pointer)sphere_swept;
  ChBodyAuxRef::ChBodyAuxRef
            (&this->super_ChBodyAuxRef,&PTR_construction_vtable_24__00b087f8,collision_type);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)0xb08298;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChBodyFrame.super_ChFrameMoving<double>.
  super_ChFrame<double>._vptr_ChFrame = (_func_int **)0xb08598;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.super_ChContactable.
  _vptr_ChContactable = (_func_int **)0xb08630;
  (this->super_ChBodyAuxRef).super_ChBody.super_ChContactable_1vars<6>.
  super_ChVariableTupleCarrier_1vars<6>._vptr_ChVariableTupleCarrier_1vars =
       (_func_int **)(vtable + 0x458);
  (this->super_ChBodyAuxRef).super_ChBody.super_ChLoadableUVW = (ChLoadableUVW)0xb08768;
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_68,filename,true,true);
  local_48.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_68._0_8_;
  local_48.super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_68._8_8_ + 8) = *(_Atomic_word *)(local_68._8_8_ + 8) + 1;
    }
  }
  local_68._16_8_ =
       (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_50 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
  p_Var1 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  SetupBody(this,&local_48,filename,(double)local_30,true,true,true,
            (shared_ptr<chrono::ChMaterialSurface> *)(local_68 + 0x10),(double)local_28);
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_48.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_);
  }
  return;
}

Assistant:

ChBodyEasyMesh::ChBodyEasyMesh(const std::string& filename,
                               double density,
                               std::shared_ptr<ChMaterialSurface> material,
                               double sphere_swept,
                               collision::ChCollisionSystemType collision_type)
    : ChBodyAuxRef(collision_type) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(filename, true, true);
    SetupBody(trimesh, filename, density, true, true, true, material, sphere_swept);
}